

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3VdbeIdxRowid(sqlite3 *db,BtCursor *pCur,i64 *rowid)

{
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  long in_FS_OFFSET;
  MemValue local_b0;
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  undefined1 *puStack_80;
  MemValue local_78;
  byte *local_70;
  undefined1 *puStack_68;
  sqlite3 *local_60;
  undefined1 *puStack_58;
  undefined1 *local_50;
  undefined1 *puStack_48;
  uint local_40;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.i = -1;
  local_70 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_68 = &DAT_aaaaaaaaaaaaaaaa;
  local_60 = (sqlite3 *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_b0.i = -1;
  local_a8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  getCellInfo(pCur);
  puStack_68._0_6_ = (uint6)(uint)puStack_68;
  puStack_58 = (undefined1 *)((ulong)puStack_58 & 0xffffffff00000000);
  local_60 = db;
  iVar4 = sqlite3VdbeMemFromBtreeZeroOffset(pCur,(pCur->info).nPayload,(Mem *)&local_78);
  pbVar1 = local_70;
  if (iVar4 == 0) {
    local_3c = (uint)*local_70;
    if ((char)*local_70 < '\0') {
      sqlite3GetVarint32(local_70,&local_3c);
    }
    uVar3 = local_3c;
    uVar2 = (uint)puStack_68;
    if (local_3c <= (uint)puStack_68 && 2 < local_3c) {
      local_40 = (uint)pbVar1[local_3c - 1];
      if ((char)pbVar1[local_3c - 1] < '\0') {
        sqlite3GetVarint32(pbVar1 + (local_3c - 1),&local_40);
      }
      if ((local_40 != 7 && 0xfffffff6 < local_40 - 10) && (uVar3 + ""[local_40] <= uVar2)) {
        sqlite3VdbeSerialGet(pbVar1 + (uVar2 - ""[local_40]),local_40,(Mem *)&local_b0);
        *rowid = (i64)local_b0;
        iVar4 = 0;
        if ((int)puStack_58 != 0) {
          vdbeMemClear((Mem *)&local_78);
        }
        goto LAB_00151cd5;
      }
    }
    if ((int)puStack_58 != 0) {
      vdbeMemClear((Mem *)&local_78);
    }
    iVar4 = 0xb;
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x160e1,
                "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
  }
LAB_00151cd5:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar4;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeIdxRowid(sqlite3 *db, BtCursor *pCur, i64 *rowid){
  i64 nCellKey = 0;
  int rc;
  u32 szHdr;        /* Size of the header */
  u32 typeRowid;    /* Serial type of the rowid */
  u32 lenRowid;     /* Size of the rowid */
  Mem m, v;

  /* Get the size of the index entry.  Only indices entries of less
  ** than 2GiB are support - anything large must be database corruption.
  ** Any corruption is detected in sqlite3BtreeParseCellPtr(), though, so
  ** this code can safely assume that nCellKey is 32-bits
  */
  assert( sqlite3BtreeCursorIsValid(pCur) );
  nCellKey = sqlite3BtreePayloadSize(pCur);
  assert( (nCellKey & SQLITE_MAX_U32)==(u64)nCellKey );

  /* Read in the complete content of the index entry */
  sqlite3VdbeMemInit(&m, db, 0);
  rc = sqlite3VdbeMemFromBtreeZeroOffset(pCur, (u32)nCellKey, &m);
  if( rc ){
    return rc;
  }

  /* The index entry must begin with a header size */
  getVarint32NR((u8*)m.z, szHdr);
  testcase( szHdr==3 );
  testcase( szHdr==(u32)m.n );
  testcase( szHdr>0x7fffffff );
  assert( m.n>=0 );
  if( unlikely(szHdr<3 || szHdr>(unsigned)m.n) ){
    goto idx_rowid_corruption;
  }

  /* The last field of the index should be an integer - the ROWID.
  ** Verify that the last entry really is an integer. */
  getVarint32NR((u8*)&m.z[szHdr-1], typeRowid);
  testcase( typeRowid==1 );
  testcase( typeRowid==2 );
  testcase( typeRowid==3 );
  testcase( typeRowid==4 );
  testcase( typeRowid==5 );
  testcase( typeRowid==6 );
  testcase( typeRowid==8 );
  testcase( typeRowid==9 );
  if( unlikely(typeRowid<1 || typeRowid>9 || typeRowid==7) ){
    goto idx_rowid_corruption;
  }
  lenRowid = sqlite3SmallTypeSizes[typeRowid];
  testcase( (u32)m.n==szHdr+lenRowid );
  if( unlikely((u32)m.n<szHdr+lenRowid) ){
    goto idx_rowid_corruption;
  }

  /* Fetch the integer off the end of the index record */
  sqlite3VdbeSerialGet((u8*)&m.z[m.n-lenRowid], typeRowid, &v);
  *rowid = v.u.i;
  sqlite3VdbeMemReleaseMalloc(&m);
  return SQLITE_OK;

  /* Jump here if database corruption is detected after m has been
  ** allocated.  Free the m object and return SQLITE_CORRUPT. */
idx_rowid_corruption:
  testcase( m.szMalloc!=0 );
  sqlite3VdbeMemReleaseMalloc(&m);
  return SQLITE_CORRUPT_BKPT;
}